

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O0

int drain_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  if (field == 1) {
    if ((*value & 1) == 0) {
      segment->mix = drain_segment_mix;
    }
    else {
      segment->mix = mix_noop;
    }
    value_local._4_4_ = 1;
  }
  else {
    value_local._4_4_ = source_segment_set(field,value,segment);
  }
  return value_local._4_4_;
}

Assistant:

int drain_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  switch(field){
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = mix_noop;
    }else{
      segment->mix = drain_segment_mix;
    }
    return 1;
  default:
    return source_segment_set(field, value, segment);
  }
}